

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlc.h
# Opt level: O0

void Wlc_BstParDefault(Wlc_BstPar_t *pPar)

{
  Wlc_BstPar_t *pPar_local;
  
  memset(pPar,0,0x48);
  pPar->iOutput = -1;
  pPar->nOutputRange = 0;
  pPar->nAdderLimit = 0;
  pPar->nMultLimit = 0;
  pPar->fGiaSimple = 0;
  pPar->fAddOutputs = 0;
  pPar->fMulti = 0;
  pPar->fBooth = 0;
  pPar->fCla = 0;
  pPar->fCreateMiter = 0;
  pPar->fCreateWordMiter = 0;
  pPar->fDecMuxes = 0;
  pPar->fVerbose = 0;
  return;
}

Assistant:

static inline void Wlc_BstParDefault( Wlc_BstPar_t * pPar )
{
    memset( pPar, 0, sizeof(Wlc_BstPar_t) );
    pPar->iOutput      = -1;
    pPar->nOutputRange =  0;
    pPar->nAdderLimit  =  0;
    pPar->nMultLimit   =  0;
    pPar->fGiaSimple   =  0;
    pPar->fAddOutputs  =  0;
    pPar->fMulti       =  0;
    pPar->fBooth       =  0;
    pPar->fCla         =  0;
    pPar->fCreateMiter =  0;
    pPar->fCreateWordMiter =  0;
    pPar->fDecMuxes    =  0;
    pPar->fVerbose     =  0;
}